

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O3

void __thiscall QDebug::putInt128(QDebug *this,void *p)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *string;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 local_48;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auVar6[0] = -(*p == '\0');
  auVar6[1] = -(*(char *)((long)p + 1) == '\0');
  auVar6[2] = -(*(char *)((long)p + 2) == '\0');
  auVar6[3] = -(*(char *)((long)p + 3) == '\0');
  auVar6[4] = -(*(char *)((long)p + 4) == '\0');
  auVar6[5] = -(*(char *)((long)p + 5) == '\0');
  auVar6[6] = -(*(char *)((long)p + 6) == '\0');
  auVar6[7] = -(*(char *)((long)p + 7) == '\0');
  auVar6[8] = -(*(char *)((long)p + 8) == '\0');
  auVar6[9] = -(*(char *)((long)p + 9) == '\0');
  auVar6[10] = -(*(char *)((long)p + 10) == '\0');
  auVar6[0xb] = -(*(char *)((long)p + 0xb) == '\0');
  auVar6[0xc] = -(*(char *)((long)p + 0xc) == '\0');
  auVar6[0xd] = -(*(char *)((long)p + 0xd) == '\0');
  auVar6[0xe] = -(*(char *)((long)p + 0xe) == '\0');
  auVar6[0xf] = -(*(char *)((long)p + 0xf) == -0x80);
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf) ==
      0xffff) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QTextStream::operator<<(&this->stream->ts,(anonymous_namespace)::Q_INT128_MIN_STR);
      return;
    }
  }
  else {
    uVar1 = *(ulong *)((long)p + 8);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0;
    if (*p == 0 && uVar1 == 0) {
      local_48 = (undefined1 *)0x30aaaaaaaaaaaaaa;
      string = (char *)((long)&local_48 + 7);
    }
    else {
      uVar2 = (long)uVar1 >> 0x3f;
      uVar5 = *p ^ uVar2;
      auVar7._8_8_ = ((uVar1 ^ uVar2) - uVar2) - (ulong)(uVar5 < uVar2);
      auVar7._0_8_ = uVar5 - uVar2;
      pcVar4 = (char *)((long)&local_48 + 7);
      do {
        string = pcVar4;
        lVar3 = auVar7._8_8_;
        uVar2 = auVar7._0_8_;
        auVar7 = __udivti3(uVar2,lVar3,10,0);
        *string = "0123456789"[uVar2 + auVar7._0_8_ * -10];
        pcVar4 = string + -1;
      } while (lVar3 != 0 || (ulong)-lVar3 < (ulong)(9 < uVar2));
      if ((long)uVar1 < 0) {
        *pcVar4 = '-';
        string = pcVar4;
      }
    }
    ::QTextStream::operator<<(&this->stream->ts,string);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putInt128([[maybe_unused]] const void *p)
{
#ifdef QT_SUPPORTS_INT128
    Q_ASSERT(p);
    qint128 i;
    memcpy(&i, p, sizeof(i)); // alignment paranoia
    if (i == Q_INT128_MIN) {
        // -i is not representable, hardcode the result:
        stream->ts << Q_INT128_MIN_STR;
    } else {
        Int128Buffer buffer;
        auto dst = i128ToStringHelper(buffer, i < 0 ? -i : i);
        if (i < 0)
            *--dst = '-';
        stream->ts << dst;
    }
    return;
#endif // QT_SUPPORTS_INT128
    stream->ts << int128Warning();
}